

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

int units_search(void *vkey,void *ventry)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*(ulong *)(*ventry + 0x18) <= *vkey) {
    uVar1 = (uint)(*(ulong *)(*ventry + 0x20) <= *vkey);
  }
  return uVar1;
}

Assistant:

static int
units_search (const void *vkey, const void *ventry)
{
  const size_t *key = (const size_t *) vkey;
  const struct unit *entry = *((const struct unit *const *) ventry);
  size_t offset;

  offset = *key;
  if (offset < entry->low_offset)
    return -1;
  else if (offset >= entry->high_offset)
    return 1;
  else
    return 0;
}